

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O3

bool __thiscall sing::HttpContext::parseRequest(HttpContext *this)

{
  HttpRequestParseState HVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  char *colon;
  undefined1 local_39;
  undefined2 local_38;
  undefined1 local_36 [2];
  undefined2 local_34;
  undefined1 local_32 [2];
  
  while( true ) {
    while (HVar1 = this->state, HVar1 != REQUEST_LINE) {
      if (HVar1 == HEADERS) {
        local_32[0] = 0;
        local_34 = 0xa0d;
        pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (pcVar2 + (this->input).readIndex,pcVar2 + (this->input).writeIndex,
                            &local_34,local_32);
        if (pcVar4 == (char *)0x0) {
          return true;
        }
        pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar4 == pcVar2 + (this->input).writeIndex) {
          return true;
        }
        local_39 = 0x3a;
        colon = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar2 + (this->input).readIndex,pcVar4,&local_39);
        if (colon == pcVar4) {
          this->state = BODY;
        }
        else {
          HttpRequest::addHeader
                    (&this->request,
                     (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + (this->input).readIndex,colon,pcVar4);
        }
        Buffer::retrieveUntil(&this->input,pcVar4 + 2);
      }
      else if (HVar1 == BODY) {
        this->state = FINSH;
        return true;
      }
    }
    local_36[0] = 0;
    local_38 = 0xa0d;
    pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (pcVar2 + (this->input).readIndex,pcVar2 + (this->input).writeIndex,&local_38
                        ,local_36);
    if (pcVar4 == (char *)0x0) {
      return true;
    }
    pcVar2 = (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar4 == pcVar2 + (this->input).writeIndex) break;
    bVar3 = parseRequestLine(this,pcVar2 + (this->input).readIndex,pcVar4);
    if (!bVar3) {
      return false;
    }
    Buffer::retrieveUntil(&this->input,pcVar4 + 2);
    this->state = HEADERS;
  }
  return true;
}

Assistant:

bool HttpContext::parseRequest(){
    bool ok = true;
    bool hasMore = true;
    while (hasMore)
    {
        if (state == REQUEST_LINE)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                ok = parseRequestLine(input.peek(),crlf);
                if(ok){
                    input.retrieveUntil(crlf + 2);
                    state = HEADERS;
                }else{
                    hasMore = false;
                }
            }else{
                hasMore = false;
            }

        }else if (state == HEADERS)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                const char* colon = std::find(input.peek(),crlf,':');
                if(colon!=crlf){
                    request.addHeader(input.peek(),colon,crlf);
                }else{
                    state = BODY;
                    hasMore = true;
                }
                input.retrieveUntil(crlf + 2);

            }else{
                hasMore = false;
            }

        }else if (state==BODY)
        {
            //TO ADD: process requestbody
            state = FINSH;
            hasMore = false;
        }
    }

    return ok;
}